

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.cpp
# Opt level: O0

response * __thiscall
CppWebSpider::requests::get
          (response *__return_storage_ptr__,requests *this,string *host,string *uri,uint16_t port,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *headers,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *data,CookieJar *cookie,int timeout)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [39];
  undefined1 local_269;
  undefined1 local_268 [64];
  string local_228 [32];
  requests local_208 [32];
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [8];
  string sendmsg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108 [32];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_e8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_e0;
  iterator iter;
  int data_count;
  string local_b0 [32];
  string local_90 [48];
  string local_60 [36];
  int local_3c;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *puStack_38;
  int sockfd;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *headers_local;
  string *psStack_28;
  uint16_t port_local;
  string *uri_local;
  string *host_local;
  requests *this_local;
  response *res;
  
  puStack_38 = headers;
  headers_local._6_2_ = port;
  psStack_28 = uri;
  uri_local = host;
  host_local = (string *)this;
  this_local = (requests *)__return_storage_ptr__;
  std::__cxx11::string::string(local_60,(string *)host);
  iVar2 = init(this,(EVP_PKEY_CTX *)local_60);
  local_3c = iVar2;
  std::__cxx11::string::~string(local_60);
  if (iVar2 < 0) {
    std::__cxx11::string::string(local_90,(string *)host);
    std::__cxx11::string::string(local_b0,(string *)uri);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&data_count,"",
               (allocator *)
               ((long)&iter.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    response::response(__return_storage_ptr__,(string *)local_90,(string *)local_b0,
                       (string *)&data_count,cookie);
    std::__cxx11::string::~string((string *)&data_count);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&iter.
                       super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                       ._M_cur + 7));
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
  }
  else {
    iter.
    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
    ._M_cur._0_4_ = 0;
    sVar3 = std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::size(data);
    if (sVar3 != 0) {
      std::__cxx11::string::operator+=((string *)uri,"?");
    }
    local_e0._M_cur =
         (__node_type *)
         std::
         unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::begin(data);
    while( true ) {
      local_e8._M_cur =
           (__node_type *)
           std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(data);
      bVar1 = std::__detail::operator!=(&local_e0,&local_e8);
      if (!bVar1) break;
      if (0 < (int)iter.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                   ._M_cur) {
        std::__cxx11::string::operator+=((string *)uri,"&");
      }
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)&local_e0);
      std::operator+(local_148,uri);
      std::operator+(local_128,(char *)local_148);
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator->((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)&local_e0);
      std::operator+(local_108,local_128);
      std::__cxx11::string::operator=((string *)uri,(string *)local_108);
      std::__cxx11::string::~string((string *)local_108);
      std::__cxx11::string::~string((string *)local_128);
      std::__cxx11::string::~string((string *)local_148);
      iter.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
      ._M_cur._0_4_ =
           (int)iter.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                ._M_cur + 1;
      std::__detail::
      _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
      ::operator++((_Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                    *)&local_e0);
    }
    std::operator+((char *)local_1e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"GET ");
    std::operator+(local_1c8,(char *)local_1e8);
    std::operator+(local_1a8,(char *)local_1c8);
    std::operator+(local_188,local_1a8);
    std::operator+(local_168,(char *)local_188);
    std::__cxx11::string::~string((string *)local_188);
    std::__cxx11::string::~string((string *)local_1a8);
    std::__cxx11::string::~string((string *)local_1c8);
    std::__cxx11::string::~string(local_1e8);
    std::__cxx11::string::string(local_228,(string *)local_168);
    std::__cxx11::string::string((string *)(local_268 + 0x20),(string *)host);
    std::__cxx11::string::string((string *)local_268,(string *)uri);
    make_header(local_208,(string *)this,(string *)local_228,(string *)(local_268 + 0x20),
                (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_268,(CookieJar *)headers);
    std::__cxx11::string::operator=((string *)local_168,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::__cxx11::string::~string((string *)local_268);
    std::__cxx11::string::~string((string *)(local_268 + 0x20));
    std::__cxx11::string::~string(local_228);
    local_269 = 0;
    std::__cxx11::string::string(local_290,(string *)host);
    std::__cxx11::string::string(local_2b0,(string *)uri);
    iVar2 = local_3c;
    std::__cxx11::string::string(local_2d0,(string *)local_168);
    request_and_recv(__return_storage_ptr__,this,(string *)local_290,(string *)local_2b0,iVar2,
                     (string *)local_2d0,cookie,timeout);
    std::__cxx11::string::~string(local_2d0);
    std::__cxx11::string::~string(local_2b0);
    std::__cxx11::string::~string(local_290);
    close(local_3c);
    local_269 = 1;
    std::__cxx11::string::~string((string *)local_168);
  }
  return __return_storage_ptr__;
}

Assistant:

response requests::get(std::string host,std::string uri,uint16_t port,
			   std::unordered_map<std::string,std::string> headers,
			   std::unordered_map<std::string,std::string> data,
			   CookieJar *cookie,
			   int timeout){
		int sockfd;
		if((sockfd=init(host,port))<0)
			return response(host,uri,"",cookie);

		int data_count=0;
		if(data.size()!=0)
			uri+="?";
		for(auto iter=data.begin();iter!=data.end();++iter){
			if(data_count>0)
				uri+="&";
			uri=uri+iter->first+"="+iter->second;
			data_count++;
		}
		//base header
		std::string sendmsg=
				"GET "+uri+" HTTP/1.1\r\n"+
				"Host: "+ host+"\r\n";

		sendmsg=make_header(sendmsg,host,uri,headers,cookie);

		response res=this->request_and_recv(host,uri,sockfd,sendmsg,cookie,timeout);
		close(sockfd);

		return res;
	}